

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,double sharpness)

{
  double dVar1;
  double __x;
  bool bVar2;
  wchar_t *pwVar3;
  ON_wString local_50;
  ON_wString format;
  double minf;
  double f;
  double p;
  uint decimal_places;
  uint max_decimal_places;
  double m;
  double s;
  double sharpness_local;
  
  bVar2 = IsValidValue(sharpness,false);
  if (bVar2) {
    dVar1 = sharpness / 4.0;
    _decimal_places = 1.0;
    for (p._0_4_ = 0; p._0_4_ < 5; p._0_4_ = p._0_4_ + 1) {
      __x = _decimal_places * 100.0 * dVar1;
      minf = floor(__x);
      if (0.5 < __x - minf) {
        minf = minf + 1.0;
      }
      minf = minf / _decimal_places;
      if (ABS(dVar1 * -100.0 + minf) <= 5e-05) {
        format.m_s = (wchar_t *)(1.0 / _decimal_places);
        if (((double)format.m_s <= minf) || (sharpness <= 0.0)) {
          if ((minf <= 100.0 - (double)format.m_s) || (4.0 <= sharpness)) {
LAB_0086e5a2:
            if (p._0_4_ == 0) {
              ON_wString::FormatToString((wchar_t *)this,SUB84(minf,0),L"%g%%");
              return (ON_wString)(wchar_t *)this;
            }
            ON_wString::FormatToString((wchar_t *)&local_50,L"%%.%df%%%%",(ulong)p._0_4_);
            pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_50);
            ON_wString::FormatToString((wchar_t *)this,SUB84(minf,0),pwVar3);
            ON_wString::~ON_wString(&local_50);
            return (ON_wString)(wchar_t *)this;
          }
          if (3 < p._0_4_) {
            minf = 100.0 - (double)format.m_s;
            goto LAB_0086e5a2;
          }
        }
        else {
          minf = (double)format.m_s;
          if (3 < p._0_4_) goto LAB_0086e5a2;
        }
      }
      _decimal_places = _decimal_places * 10.0;
    }
    ON_wString::FormatToString((wchar_t *)this,SUB84(dVar1 * 100.0,0),L"%g%%");
  }
  else if ((sharpness != 5.0) || (NAN(sharpness))) {
    ON_wString::ON_wString((ON_wString *)this,L'⚠',1);
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,L"crease");
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(double sharpness)
{
  if ( ON_SubDEdgeSharpness::IsValidValue(sharpness,false) )
  {
    const double s = sharpness / ON_SubDEdgeSharpness::MaximumValue;
    double m = 1.0; 
    unsigned max_decimal_places = 4;
    for (unsigned decimal_places = 0; decimal_places <= max_decimal_places; ++decimal_places, m *= 10.0 )
    {
      double p = 100.0 * m * s;
      double f = floor(p);
      if (p - f > 0.5)
        f = f + 1.0;
      f /= m;
      if (fabs(f - 100.0*s) <= 0.00005)
      {
        double minf = 1.0 / m;
        if (f < minf && sharpness > 0.0)
        {
          if (decimal_places < max_decimal_places)
            continue;          
          f = minf;
        }
        else if (f > 100.0 - minf && sharpness < ON_SubDEdgeSharpness::MaximumValue)
        {
          if (decimal_places < max_decimal_places)
            continue;
          f = 100.0 - minf;
        }
        if (0 == decimal_places)
          return ON_wString::FormatToString(L"%g%%", f);
        const ON_wString format = ON_wString::FormatToString(L"%%.%df%%%%", decimal_places);
        return ON_wString::FormatToString(format, f);
      }
    }
    return ON_wString::FormatToString(L"%g%%", s*100.0);
  }

  if (ON_SubDEdgeSharpness::CreaseValue == sharpness)
    return ON_wString(L"crease");

  return ON_wString(ON_wString::WarningSign);
}